

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O3

void __thiscall
TPZAnalysis::ShowShape(TPZAnalysis *this,string *plotfile,TPZVec<long> *equationindices)

{
  int iVar1;
  long lVar2;
  undefined1 *puVar3;
  long *plVar4;
  long *plVar5;
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  vecnames;
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  scalnames;
  long *local_320 [2];
  long local_310 [2];
  long *local_300 [2];
  long local_2f0 [2];
  TPZManVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  local_2e0;
  TPZManVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  local_180;
  
  this->fStep = 1;
  lVar2 = 0x30;
  do {
    puVar3 = (undefined1 *)
             ((long)&(((TPZManVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
                        *)(local_180.fExtAlloc + -1))->
                     super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     )._vptr_TPZVec + lVar2);
    *(undefined1 **)((long)(local_180.fExtAlloc + -2) + 0x10 + lVar2) = puVar3;
    *(undefined8 *)((long)(local_180.fExtAlloc + -2) + 0x18 + lVar2) = 0;
    *puVar3 = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x170);
  local_180.
  super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  fStore = local_180.fExtAlloc;
  local_180.
  super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  fNElements = 0;
  local_180.
  super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  fNAlloc = 0;
  local_180.
  super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019679f0;
  lVar2 = 0x30;
  do {
    puVar3 = (undefined1 *)
             ((long)&(((TPZManVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
                        *)(local_2e0.fExtAlloc + -1))->
                     super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     )._vptr_TPZVec + lVar2);
    *(undefined1 **)((long)local_2f0 + lVar2) = puVar3;
    *(undefined8 *)((long)local_2f0 + lVar2 + 8) = 0;
    *puVar3 = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x170);
  local_2e0.
  super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  fStore = local_2e0.fExtAlloc;
  local_2e0.
  super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  fNElements = 0;
  local_2e0.
  super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  fNAlloc = 0;
  local_2e0.
  super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019679f0;
  iVar1 = (**(code **)(*(long *)(this->fCompMesh->fMaterialVec)._M_t._M_impl.super__Rb_tree_header.
                                _M_header._M_left[1]._M_parent + 0x78))();
  if (iVar1 == 1) {
    plVar5 = local_2f0;
    local_300[0] = plVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"Solution","");
    (*local_180.
      super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._vptr_TPZVec[3])(&local_180,
                        local_180.
                        super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .fNElements + 1);
    std::__cxx11::string::_M_assign
              ((string *)
               (local_180.
                super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .fStore +
               local_180.
               super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .fNElements + -1));
    plVar4 = local_300[0];
  }
  else {
    plVar5 = local_310;
    local_320[0] = plVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Solution","");
    (*local_2e0.
      super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._vptr_TPZVec[3])(&local_2e0,
                        local_2e0.
                        super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .fNElements + 1);
    std::__cxx11::string::_M_assign
              ((string *)
               (local_2e0.
                super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .fStore +
               local_2e0.
               super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .fNElements + -1));
    plVar4 = local_320[0];
  }
  if (plVar4 != plVar5) {
    operator_delete(plVar4,*plVar5 + 1);
  }
  ShowShapeInternal<double>
            (this,(TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
                   *)&local_180,
             (TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
              *)&local_2e0,plotfile,equationindices);
  TPZManVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  ::~TPZManVector(&local_2e0);
  TPZManVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  ::~TPZManVector(&local_180);
  return;
}

Assistant:

void TPZAnalysis::ShowShape(const std::string &plotfile, TPZVec<int64_t> &equationindices)
{
	
    SetStep(1);
    TPZStack<std::string> scalnames,vecnames;
    TPZMaterial *mat = fCompMesh->MaterialVec().begin()->second;
    int nstate = mat->NStateVariables();
    if (nstate == 1) {
        scalnames.Push("Solution");
    }
    else
    {
        vecnames.Push("Solution");
    }
    //TODOCOMPLEX
    ShowShapeInternal<STATE>(scalnames,vecnames,plotfile,equationindices);
}